

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wizard.c
# Opt level: O1

void intervene(void)

{
  boolean bVar1;
  uint uVar2;
  char *pcVar3;
  
  bVar1 = on_level(&u.uz,&dungeon_topology.d_astral_level);
  uVar2 = mt_random();
  if (bVar1 != '\0') {
    switch(uVar2 & 3) {
    case 0:
      pline("You feel vaguely nervous.");
      return;
    case 2:
      aggravate();
      return;
    case 3:
      nasty((monst *)0x0);
      return;
    }
    if (((u.uprops[0x1e].intrinsic == 0) &&
        (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
         (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
       ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
      pcVar3 = hcolor("black");
      pline("You notice a %s glow surrounding you.",pcVar3);
    }
    rndcurse();
    return;
  }
  (*(code *)(&DAT_002d96f0 + *(int *)(&DAT_002d96f0 + (ulong)(uVar2 % 6) * 4)))();
  return;
}

Assistant:

void intervene(void)
{
	int which = Is_astralevel(&u.uz) ? rnd(4) : rn2(6);
	/* cases 0 and 5 don't apply on the Astral level */
	switch (which) {
	    case 0:
	    case 1:	pline("You feel vaguely nervous.");
			break;
	    case 2:	if (!Blind)
			    pline("You notice a %s glow surrounding you.",
				  hcolor("black"));
			rndcurse();
			break;
	    case 3:	aggravate();
			break;
	    case 4:	nasty(NULL);
			break;
	    case 5:	resurrect();
			break;
	}
}